

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cc
# Opt level: O0

Token * __thiscall onmt::Tokenizer::annotate_token(Tokenizer *this,string *word)

{
  bool bVar1;
  ulong in_RDX;
  string *in_RSI;
  Token *in_RDI;
  size_t sublen;
  size_t subpos;
  Token *token;
  undefined5 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff85;
  undefined1 in_stack_ffffffffffffff86;
  undefined1 in_stack_ffffffffffffff87;
  Token *str;
  string *in_stack_ffffffffffffffa0;
  
  str = in_RDI;
  Token::Token((Token *)CONCAT17(in_stack_ffffffffffffff87,
                                 CONCAT16(in_stack_ffffffffffffff86,
                                          CONCAT15(in_stack_ffffffffffffff85,
                                                   in_stack_ffffffffffffff80))));
  std::__cxx11::string::size();
  if ((in_RSI[2].field_2._M_local_buf[8] & 1U) == 0) {
    bVar1 = ends_with(in_stack_ffffffffffffffa0,in_RSI);
    if (bVar1) {
      in_RDI->join_right = true;
      std::__cxx11::string::length();
    }
    bVar1 = starts_with(&str->surface,&in_RDI->surface);
    if (bVar1) {
      in_RDI->join_left = true;
      std::__cxx11::string::length();
      std::__cxx11::string::length();
    }
  }
  else {
    bVar1 = starts_with(&str->surface,&in_RDI->surface);
    if (bVar1) {
      std::__cxx11::string::length();
      std::__cxx11::string::length();
    }
    else {
      in_RDI->join_left = true;
    }
  }
  std::__cxx11::string::substr((ulong)&stack0xffffffffffffffa0,in_RDX);
  std::__cxx11::string::operator=((string *)in_RDI,(string *)&stack0xffffffffffffffa0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
  return str;
}

Assistant:

Token Tokenizer::annotate_token(const std::string& word) const
  {
    Token token;
    size_t subpos = 0;
    size_t sublen = word.size();

    if (_options.spacer_annotate)
    {
      if (starts_with(word, spacer_marker))
      {
        subpos += spacer_marker.length();
        sublen -= spacer_marker.length();
      }
      else
        token.join_left = true;
    }
    else
    {
      if (ends_with(word, _options.joiner))
      {
        token.join_right = true;
        sublen -= _options.joiner.length();
      }
      if (starts_with(word, _options.joiner))
      {
        token.join_left = true;
        subpos += _options.joiner.length();
        sublen -= _options.joiner.length();
      }
    }

    token.surface = word.substr(subpos, sublen);
    return token;
  }